

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_mvo(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src)

{
  int mmu_idx_00;
  uint uVar1;
  uint offset;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  S390Access local_f0;
  S390Access local_c8;
  uint local_a0;
  uint local_9c;
  int j;
  int i;
  S390Access desta;
  S390Access srca;
  uint8_t byte_src;
  uint8_t byte_dest;
  uintptr_t ra;
  int len_src;
  int len_dest;
  int mmu_idx;
  uint64_t src_local;
  uint64_t dest_local;
  uint32_t l_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  uVar1 = l >> 4;
  offset = l & 0xf;
  access_prepare(&local_c8,env,src,offset + 1,MMU_DATA_LOAD,mmu_idx_00,unaff_retaddr);
  memcpy(&desta.size1,&local_c8,0x28);
  access_prepare(&local_f0,env,dest,uVar1 + 1,MMU_DATA_STORE,mmu_idx_00,unaff_retaddr);
  memcpy(&j,&local_f0,0x28);
  uVar2 = cpu_ldub_data_ra_s390x(env,(dest + (long)(int)(uVar1 + 1)) - 1,unaff_retaddr);
  srca.mmu_idx._2_1_ = access_get_byte(env,(S390Access *)&desta.size1,offset,unaff_retaddr);
  access_set_byte(env,(S390Access *)&j,uVar1,(byte)uVar2 & 0xf | srca.mmu_idx._2_1_ << 4,
                  unaff_retaddr);
  local_a0 = offset;
  local_9c = uVar1;
  while (local_9c = local_9c - 1, local_a0 = local_a0 - 1, -1 < (int)local_9c) {
    uVar1 = (uint)srca.mmu_idx._2_1_;
    if ((int)local_a0 < 0) {
      srca.mmu_idx._2_1_ = 0;
    }
    else {
      srca.mmu_idx._2_1_ = access_get_byte(env,(S390Access *)&desta.size1,local_a0,unaff_retaddr);
    }
    access_set_byte(env,(S390Access *)&j,local_9c,(byte)((int)uVar1 >> 4) | srca.mmu_idx._2_1_ << 4,
                    unaff_retaddr);
  }
  return;
}

Assistant:

void HELPER(mvo)(CPUS390XState *env, uint32_t l, uint64_t dest, uint64_t src)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    /* MVO always processes one more byte than specified - maximum is 16 */
    const int len_dest = (l >> 4) + 1;
    const int len_src = (l & 0xf) + 1;
    uintptr_t ra = GETPC();
    uint8_t byte_dest, byte_src;
    S390Access srca, desta;
    int i, j;

    srca = access_prepare(env, src, len_src, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, len_dest, MMU_DATA_STORE, mmu_idx, ra);

    /* Handle rightmost byte */
    byte_dest = cpu_ldub_data_ra(env, dest + len_dest - 1, ra);
    byte_src = access_get_byte(env, &srca, len_src - 1, ra);
    byte_dest = (byte_dest & 0x0f) | (byte_src << 4);
    access_set_byte(env, &desta, len_dest - 1, byte_dest, ra);

    /* Process remaining bytes from right to left */
    for (i = len_dest - 2, j = len_src - 2; i >= 0; i--, j--) {
        byte_dest = byte_src >> 4;
        if (j >= 0) {
            byte_src = access_get_byte(env, &srca, j, ra);
        } else {
            byte_src = 0;
        }
        byte_dest |= byte_src << 4;
        access_set_byte(env, &desta, i, byte_dest, ra);
    }
}